

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::Write3dmGoo(ON_BinaryArchive *this,ON_3dmGoo *goo)

{
  bool bVar1;
  ON__UINT32 i;
  bool bVar2;
  
  i = goo->m_typecode;
  if (i == 0) {
    return false;
  }
  bVar1 = this->m_bDoChunkCRC;
  this->m_bDoChunkCRC = false;
  if ((int)i < 0) {
    if (goo->m_value != 0) {
      bVar2 = false;
      if ((goo->m_value < 1) || (bVar2 = false, goo->m_goo == (uchar *)0x0)) goto LAB_003cb480;
    }
    bVar2 = WriteInt(this,i);
    if ((bVar2) && (bVar2 = WriteInt(this,goo->m_value), bVar2)) {
      if ((long)goo->m_value < 1) {
        bVar2 = true;
      }
      else {
        bVar2 = WriteByte(this,(long)goo->m_value,goo->m_goo);
      }
      goto LAB_003cb480;
    }
  }
  else {
    bVar2 = WriteInt(this,i);
    if (bVar2) {
      bVar2 = WriteInt(this,goo->m_value);
      goto LAB_003cb480;
    }
  }
  bVar2 = false;
LAB_003cb480:
  this->m_bDoChunkCRC = bVar1;
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::Write3dmGoo( const ON_3dmGoo& goo )
{
  bool rc = false;

  if ( goo.m_typecode ) {
    const bool savedDoCRC = m_bDoChunkCRC;
    m_bDoChunkCRC = false;
    if ( 0 != (goo.m_typecode & TCODE_SHORT) ) {
      if ( goo.m_value == 0 || (goo.m_value > 0 && goo.m_goo) ) {
        // write long chunk - do not use Begin/EndWrite3dmChunk() because
        //                    goo may contain subchunks and CRC would be
        //                    incorrectly computed.
        rc = WriteInt( goo.m_typecode );
        if (rc) rc = WriteInt( goo.m_value );
        if (rc && goo.m_value>0) rc = WriteByte( goo.m_value, goo.m_goo );
      }
    }
    else {
      // write short chunk
      rc = WriteInt( goo.m_typecode );
      if (rc) rc = WriteInt( goo.m_value );
    }
    m_bDoChunkCRC = savedDoCRC;
  }
  
  return rc;
}